

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::UpdateWaterLevel(AActor *this,bool dosplash)

{
  uint uVar1;
  sector_t *sec;
  bool bVar2;
  sector_t_conflict *psVar3;
  xfloor *this_00;
  F3DFloor **ppFVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  DVector3 local_80;
  double local_68;
  double ff_top;
  double ff_bottom;
  F3DFloor *rover;
  iterator __end3;
  iterator __begin3;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range3;
  sector_t *hsec;
  double dStack_28;
  bool reset;
  double fh;
  BYTE lastwaterlevel;
  bool dosplash_local;
  AActor *this_local;
  
  uVar1 = this->waterlevel;
  dStack_28 = -3.4028234663852886e+38;
  bVar5 = false;
  this->waterlevel = 0;
  if (this->Sector == (sector_t *)0x0) {
    return false;
  }
  if ((this->Sector->MoreFlags & 0x20) != 0) {
    this->waterlevel = 3;
    goto LAB_005b12c2;
  }
  psVar3 = sector_t::GetHeightSec(this->Sector);
  if (psVar3 == (sector_t_conflict *)0x0) {
    this_00 = &this->Sector->e->XFloor;
    __end3 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
    rover = (F3DFloor *)
            TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
    while (bVar2 = TIterator<F3DFloor_*>::operator!=(&__end3,(TIterator<F3DFloor_*> *)&rover), bVar2
          ) {
      ppFVar4 = TIterator<F3DFloor_*>::operator*(&__end3);
      ff_bottom = (double)*ppFVar4;
      if ((((((F3DFloor *)ff_bottom)->flags & 1) != 0) &&
          ((((F3DFloor *)ff_bottom)->flags & 0x10) != 0)) &&
         ((((F3DFloor *)ff_bottom)->flags & 2) == 0)) {
        ff_top = secplane_t::ZatPoint((((F3DFloor *)ff_bottom)->bottom).plane,this);
        dVar7 = secplane_t::ZatPoint(*(secplane_t **)((long)ff_bottom + 0x28),this);
        local_68 = dVar7;
        dVar8 = Z(this);
        dVar6 = ff_top;
        if ((dVar8 < dVar7) && (dVar8 = Center(this), dVar7 = local_68, dVar6 <= dVar8)) {
          dStack_28 = local_68;
          dVar6 = Z(this);
          if (dVar6 < dVar7) {
            this->waterlevel = 1;
            dVar6 = Center(this);
            if ((dVar6 < dVar7) &&
               (((this->waterlevel = 2, this->player != (player_t *)0x0 &&
                 (dVar6 = Z(this), dVar6 + this->player->viewheight <= dVar7)) ||
                (dVar6 = Top(this), dVar6 <= dVar7)))) {
              this->waterlevel = 3;
            }
          }
          break;
        }
      }
      TIterator<F3DFloor_*>::operator++(&__end3);
    }
    goto LAB_005b12c2;
  }
  dStack_28 = secplane_t::ZatPoint(&psVar3->floorplane,this);
  dVar6 = Z(this);
  if (dStack_28 <= dVar6) {
    if ((psVar3->MoreFlags & 2) == 0) {
      dVar6 = Top(this);
      dVar7 = secplane_t::ZatPoint(&psVar3->ceilingplane,this);
      if (dVar7 < dVar6) {
        this->waterlevel = 3;
        goto LAB_005b10d8;
      }
    }
    this->waterlevel = 0;
  }
  else {
    this->waterlevel = 1;
    dVar6 = Center(this);
    if ((dVar6 < dStack_28) &&
       (((this->waterlevel = 2, this->player != (player_t *)0x0 &&
         (dVar6 = Z(this), dVar6 + this->player->viewheight <= dStack_28)) ||
        (dVar6 = Top(this), dVar6 <= dStack_28)))) {
      this->waterlevel = 3;
    }
  }
LAB_005b10d8:
  bVar5 = (psVar3->MoreFlags & 0x60) == 0;
LAB_005b12c2:
  if (((this->boomwaterlevel == '\0') && (this->waterlevel != 0)) && (dosplash)) {
    sec = this->Sector;
    PosAtZ(&local_80,this,dStack_28);
    P_HitWater(this,sec,&local_80,true,true,false);
  }
  this->boomwaterlevel = (BYTE)this->waterlevel;
  if (bVar5) {
    this->waterlevel = uVar1 & 0xff;
  }
  return false;
}

Assistant:

bool AActor::UpdateWaterLevel (bool dosplash)
{
	BYTE lastwaterlevel = waterlevel;
	double fh = -FLT_MAX;
	bool reset=false;

	waterlevel = 0;

	if (Sector == NULL)
	{
		return false;
	}

	if (Sector->MoreFlags & SECF_UNDERWATER)	// intentionally not SECF_UNDERWATERMASK
	{
		waterlevel = 3;
	}
	else
	{
		const sector_t *hsec = Sector->GetHeightSec();
		if (hsec != NULL)
		{
			fh = hsec->floorplane.ZatPoint (this);
			//if (hsec->MoreFlags & SECF_UNDERWATERMASK)	// also check Boom-style non-swimmable sectors
			{
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}
				else if (!(hsec->MoreFlags & SECF_FAKEFLOORONLY) && (Top() > hsec->ceilingplane.ZatPoint (this)))
				{
					waterlevel = 3;
				}
				else
				{
					waterlevel = 0;
				}
			}
			// even non-swimmable deep water must be checked here to do the splashes correctly
			// But the water level must be reset when this function returns
			if (!(hsec->MoreFlags&SECF_UNDERWATERMASK))
			{
				reset = true;
			}
		}
		else
		{
			// Check 3D floors as well!
			for(auto rover : Sector->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if(!(rover->flags & FF_SWIMMABLE) || rover->flags & FF_SOLID) continue;

				double ff_bottom=rover->bottom.plane->ZatPoint(this);
				double ff_top=rover->top.plane->ZatPoint(this);

				if(ff_top <= Z() || ff_bottom > (Center())) continue;
				
				fh=ff_top;
				if (Z() < fh)
				{
					waterlevel = 1;
					if (Center() < fh)
					{
						waterlevel = 2;
						if ((player && Z() + player->viewheight <= fh) ||
							(Top() <= fh))
						{
							waterlevel = 3;
						}
					}
				}

				break;
			}
		}
	}
		
	// some additional checks to make deep sectors like Boom's splash without setting
	// the water flags. 
	if (boomwaterlevel == 0 && waterlevel != 0 && dosplash) 
	{
		P_HitWater(this, Sector, PosAtZ(fh), true);
	}
	boomwaterlevel = waterlevel;
	if (reset)
	{
		waterlevel = lastwaterlevel;
	}
	return false;	// we did the splash ourselves
}